

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O3

void __thiscall LogStream::formatInteger<unsigned_long_long>(LogStream *this,unsigned_long_long v)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  char **ppcVar5;
  long lVar6;
  char *pcVar7;
  
  pcVar2 = (this->buffer_).cur_;
  ppcVar5 = &(this->buffer_).cur_;
  if (0x1f < (int)ppcVar5 - (int)pcVar2) {
    lVar6 = 0;
    pcVar7 = pcVar2 + -1;
    do {
      pcVar4 = pcVar7;
      pcVar4[1] = zero[v % 10];
      pcVar7 = pcVar4 + 1;
      lVar6 = lVar6 + 1;
      bVar3 = 9 < v;
      v = v / 10;
    } while (bVar3);
    pcVar4[2] = '\0';
    if (pcVar2 < pcVar7) {
      do {
        pcVar4 = pcVar2 + 1;
        cVar1 = *pcVar2;
        *pcVar2 = *pcVar7;
        *pcVar7 = cVar1;
        pcVar7 = pcVar7 + -1;
        pcVar2 = pcVar4;
      } while (pcVar4 < pcVar7);
    }
    *ppcVar5 = *ppcVar5 + lVar6;
  }
  return;
}

Assistant:

int avail() const { return static_cast<int>(end()-cur_); }